

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InprocComms.cpp
# Opt level: O0

string * __thiscall helics::inproc::InprocComms::getAddress_abi_cxx11_(InprocComms *this)

{
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000028;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000030;
  
  std::__cxx11::string::string(in_stack_00000030,in_stack_00000028);
  return in_RDI;
}

Assistant:

std::string InprocComms::getAddress() const
    {
        return localTargetAddress;
    }